

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegistryAccess.cpp
# Opt level: O1

void bhf::ads::ParseHexData(RegistryEntry *value,char **it,istream *input,size_t *lineNumber)

{
  char cVar1;
  char *pcVar2;
  byte bVar3;
  int iVar4;
  istream *piVar5;
  ostream *poVar6;
  runtime_error *prVar7;
  char cVar8;
  long lVar9;
  string line;
  stringstream ss;
  string local_1f8 [32];
  char *local_1d8;
  undefined8 local_1d0;
  char local_1c8 [16];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  local_1d8 = local_1c8;
  local_1d0 = 0;
  local_1c8[0] = '\0';
  do {
    while( true ) {
      pcVar2 = *it;
      cVar8 = *pcVar2;
      if (cVar8 != ',') break;
      *it = pcVar2 + 1;
      if (pcVar2[1] == ',') {
        std::__cxx11::stringstream::stringstream(local_1b8);
        if (*lineNumber == 0xffffffffffffffff) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,"Invalid network data: ",0x16);
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"two subsequent commas",0x15)
          ;
          local_1f8[0] = (string)0xa;
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_1f8,1);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Invalid file format: ",0x15)
          ;
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"two subsequent commas",0x15)
          ;
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8," in line ",9);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          local_1f8[0] = (string)0xa;
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_1f8,1);
        }
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar7,local_1f8);
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    if (cVar8 == '\\') {
      *it = pcVar2 + 1;
      if (pcVar2[1] != '\0') {
        std::__cxx11::stringstream::stringstream(local_1b8);
        if (*lineNumber == 0xffffffffffffffff) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,"Invalid network data: ",0x16);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,"data continuation line should be the las character in line",0x3a);
          local_1f8[0] = (string)0xa;
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_1f8,1);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Invalid file format: ",0x15)
          ;
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,"data continuation line should be the las character in line",0x3a);
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8," in line ",9);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          local_1f8[0] = (string)0xa;
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_1f8,1);
        }
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar7,local_1f8);
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      cVar8 = std::ios::widen((char)*(undefined8 *)(*(long *)input + -0x18) + (char)input);
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (input,(string *)&local_1d8,cVar8);
      pcVar2 = local_1d8;
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) {
        std::__cxx11::stringstream::stringstream(local_1b8);
        if (*lineNumber == 0xffffffffffffffff) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,"Invalid network data: ",0x16);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,"data continuation line next line is missing",0x2b);
          local_1f8[0] = (string)0xa;
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_1f8,1);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Invalid file format: ",0x15)
          ;
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,"data continuation line next line is missing",0x2b);
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8," in line ",9);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          local_1f8[0] = (string)0xa;
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_1f8,1);
        }
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar7,local_1f8);
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      *it = local_1d8;
      iVar4 = strncmp("  ",local_1d8,2);
      if (iVar4 != 0) {
        std::__cxx11::stringstream::stringstream(local_1b8);
        if (*lineNumber == 0xffffffffffffffff) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,"Invalid network data: ",0x16);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,"data continuation line should start with two spaces",0x33);
          local_1f8[0] = (string)0xa;
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_1f8,1);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Invalid file format: ",0x15)
          ;
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,"data continuation line should start with two spaces",0x33);
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8," in line ",9);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          local_1f8[0] = (string)0xa;
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_1f8,1);
        }
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar7,local_1f8);
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      *it = pcVar2 + 2;
    }
    else if (cVar8 == '\0') {
      VerifyDataLen(value->type,value->dataLen,*lineNumber);
      if (local_1d8 != local_1c8) {
        operator_delete(local_1d8);
      }
      return;
    }
    pcVar2 = *it;
    lVar9 = 0;
    do {
      iVar4 = isxdigit((int)pcVar2[lVar9]);
      if (iVar4 == 0) {
        std::__cxx11::stringstream::stringstream(local_1b8);
        if (*lineNumber == 0xffffffffffffffff) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,"Invalid network data: ",0x16);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,"invalid hex character \'",0x17);
          local_1f8[0] = *(string *)(*it + lVar9);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_1f8,1)
          ;
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\'",1);
          local_1f8[0] = (string)0xa;
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_1f8,1);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Invalid file format: ",0x15)
          ;
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,"invalid hex character \'",0x17);
          local_1f8[0] = *(string *)(*it + lVar9);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_1f8,1)
          ;
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\'",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," in line ",9);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          local_1f8[0] = (string)0xa;
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_1f8,1);
        }
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar7,local_1f8);
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 == 1);
    pcVar2 = *it;
    cVar8 = *pcVar2;
    if (cVar8 < 0x41) {
      cVar8 = cVar8 + -0x30;
    }
    else {
      iVar4 = toupper((int)cVar8);
      cVar8 = (char)iVar4 + -0x37;
    }
    cVar1 = pcVar2[1];
    if (cVar1 < 0x41) {
      bVar3 = cVar1 - 0x30;
    }
    else {
      iVar4 = toupper((int)cVar1);
      bVar3 = (char)iVar4 - 0x37;
    }
    local_1b8[0] = (stringstream)(bVar3 & 0xf | cVar8 << 4);
    RegistryEntry::Append(value,local_1b8,1);
    value->dataLen = value->dataLen + 1;
    pcVar2 = *it;
    *it = pcVar2 + 2;
    cVar8 = pcVar2[2];
  } while ((cVar8 == '\0') || (cVar8 == ','));
  std::__cxx11::stringstream::stringstream(local_1b8);
  if (*lineNumber == 0xffffffffffffffff) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Invalid network data: ",0x16);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"two subsequent values",0x15);
    local_1f8[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_1f8,1);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Invalid file format: ",0x15);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"two subsequent values",0x15);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8," in line ",9);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    local_1f8[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_1f8,1);
  }
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar7,local_1f8);
  __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void ParseHexData(bhf::ads::RegistryEntry& value, const char*& it, std::istream& input, size_t& lineNumber)
{
    std::string line{};
    for ( ; '\0' != *it; ) {
        // Skip commas but ensure there is exactly one
        if (',' == *it) {
            ++it;
            if (',' == *it) {
                PARSING_EXCEPTION("two subsequent commas");
            }
            continue;
        }

        // Data is allowed to containe linebreaks. However, we treat comments or empty lines
        // in such a multiline data section as error.
        if ('\\' == *it) {
            ++it;
            if ('\0' != *it) {
                PARSING_EXCEPTION("data continuation line should be the las character in line");
            }

            if (!std::getline(input, line)) {
                PARSING_EXCEPTION("data continuation line next line is missing");
            }
            it = line.c_str();
            if (strncmp("  ", it, 2)) {
                PARSING_EXCEPTION("data continuation line should start with two spaces");
            }
            it += 2;
        }

        // We only accept hex data values consisting of two characters (trailing 0)
        for (auto i = 0; i < 2; ++i) {
            if (!isxdigit(it[i])) {
                PARSING_EXCEPTION("invalid hex character '" << it[i] << "'");
            }
        }
        const uint8_t byte = (hex2val(it[0]) << 4) | (hex2val(it[1]) & 0xF);
        value.PushData(byte);
        it += 2;

        // Hex data values should be separated by a comma
        if (*it && (',' != *it)) {
            PARSING_EXCEPTION("two subsequent values");
        }
    }
    VerifyDataLen(value.type, value.dataLen, lineNumber);
}